

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Document::ReadHeader(Document *this)

{
  uint uVar1;
  Element *pEVar2;
  Scope *pSVar3;
  Token *pTVar4;
  ImportSettings *pIVar5;
  Token *t;
  allocator<char> local_2c1;
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  Scope *local_1b0;
  Scope *stimestamp;
  string local_1a0;
  Element *local_180;
  Element *etimestamp;
  allocator<char> local_151;
  string local_150;
  Element *local_130;
  Element *ecreator;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  Scope *local_88;
  Scope *shead;
  string local_78;
  allocator<char> local_41;
  string local_40;
  Element *local_20;
  Element *ehead;
  Scope *sc;
  Document *this_local;
  
  sc = (Scope *)this;
  pEVar2 = (Element *)Parser::GetRootScope(this->parser);
  ehead = pEVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"FBXHeaderExtension",&local_41);
  pEVar2 = Scope::operator[]((Scope *)pEVar2,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_20 = pEVar2;
  if (pEVar2 != (Element *)0x0) {
    pSVar3 = Element::Compound(pEVar2);
    if (pSVar3 != (Scope *)0x0) {
      pSVar3 = Element::Compound(local_20);
      local_88 = pSVar3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"FBXVersion",&local_a9)
      ;
      pEVar2 = GetRequiredElement(pSVar3,&local_a8,local_20);
      pTVar4 = GetRequiredToken(pEVar2,0);
      uVar1 = ParseTokenAsInt(pTVar4);
      this->fbxVersion = uVar1;
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
      if (this->fbxVersion < 0x1bbc) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,
                   "unsupported, old format version, supported are only FBX 2011, FBX 2012 and FBX 2013"
                   ,&local_d1);
        Util::DOMError(&local_d0,(Element *)0x0);
      }
      if (0x1ce8 < this->fbxVersion) {
        pIVar5 = Settings(this);
        if ((pIVar5->strictMode & 1U) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f8,
                     "unsupported, newer format version, supported are only FBX 2011, FBX 2012 and FBX 2013 (turn off strict mode to try anyhow) "
                     ,&local_f9);
          Util::DOMError(&local_f8,(Element *)0x0);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,
                   "unsupported, newer format version, supported are only FBX 2011, FBX 2012 and FBX 2013, trying to read it nevertheless"
                   ,(allocator<char> *)((long)&ecreator + 7));
        Util::DOMWarning(&local_120,(Element *)0x0);
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator((allocator<char> *)((long)&ecreator + 7));
      }
      pSVar3 = local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"Creator",&local_151);
      pEVar2 = Scope::operator[](pSVar3,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator(&local_151);
      local_130 = pEVar2;
      if (pEVar2 != (Element *)0x0) {
        pTVar4 = GetRequiredToken(pEVar2,0);
        ParseTokenAsString_abi_cxx11_((string *)&etimestamp,(FBX *)pTVar4,t);
        std::__cxx11::string::operator=((string *)&this->creator,(string *)&etimestamp);
        std::__cxx11::string::~string((string *)&etimestamp);
      }
      pSVar3 = local_88;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a0,"CreationTimeStamp",(allocator<char> *)((long)&stimestamp + 7)
                );
      pEVar2 = Scope::operator[](pSVar3,&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&stimestamp + 7));
      if (pEVar2 != (Element *)0x0) {
        local_180 = pEVar2;
        pSVar3 = Element::Compound(pEVar2);
        if (pSVar3 != (Scope *)0x0) {
          pSVar3 = Element::Compound(local_180);
          local_1b0 = pSVar3;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"Year",&local_1d1)
          ;
          pEVar2 = GetRequiredElement(pSVar3,&local_1d0,(Element *)0x0);
          pTVar4 = GetRequiredToken(pEVar2,0);
          uVar1 = ParseTokenAsInt(pTVar4);
          this->creationTimeStamp[0] = uVar1;
          std::__cxx11::string::~string((string *)&local_1d0);
          std::allocator<char>::~allocator(&local_1d1);
          pSVar3 = local_1b0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1f8,"Month",&local_1f9);
          pEVar2 = GetRequiredElement(pSVar3,&local_1f8,(Element *)0x0);
          pTVar4 = GetRequiredToken(pEVar2,0);
          uVar1 = ParseTokenAsInt(pTVar4);
          this->creationTimeStamp[1] = uVar1;
          std::__cxx11::string::~string((string *)&local_1f8);
          std::allocator<char>::~allocator(&local_1f9);
          pSVar3 = local_1b0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,"Day",&local_221);
          pEVar2 = GetRequiredElement(pSVar3,&local_220,(Element *)0x0);
          pTVar4 = GetRequiredToken(pEVar2,0);
          uVar1 = ParseTokenAsInt(pTVar4);
          this->creationTimeStamp[2] = uVar1;
          std::__cxx11::string::~string((string *)&local_220);
          std::allocator<char>::~allocator(&local_221);
          pSVar3 = local_1b0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"Hour",&local_249)
          ;
          pEVar2 = GetRequiredElement(pSVar3,&local_248,(Element *)0x0);
          pTVar4 = GetRequiredToken(pEVar2,0);
          uVar1 = ParseTokenAsInt(pTVar4);
          this->creationTimeStamp[3] = uVar1;
          std::__cxx11::string::~string((string *)&local_248);
          std::allocator<char>::~allocator(&local_249);
          pSVar3 = local_1b0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_270,"Minute",&local_271);
          pEVar2 = GetRequiredElement(pSVar3,&local_270,(Element *)0x0);
          pTVar4 = GetRequiredToken(pEVar2,0);
          uVar1 = ParseTokenAsInt(pTVar4);
          this->creationTimeStamp[4] = uVar1;
          std::__cxx11::string::~string((string *)&local_270);
          std::allocator<char>::~allocator(&local_271);
          pSVar3 = local_1b0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_298,"Second",&local_299);
          pEVar2 = GetRequiredElement(pSVar3,&local_298,(Element *)0x0);
          pTVar4 = GetRequiredToken(pEVar2,0);
          uVar1 = ParseTokenAsInt(pTVar4);
          this->creationTimeStamp[5] = uVar1;
          std::__cxx11::string::~string((string *)&local_298);
          std::allocator<char>::~allocator(&local_299);
          pSVar3 = local_1b0;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2c0,"Millisecond",&local_2c1);
          pEVar2 = GetRequiredElement(pSVar3,&local_2c0,(Element *)0x0);
          pTVar4 = GetRequiredToken(pEVar2,0);
          uVar1 = ParseTokenAsInt(pTVar4);
          this->creationTimeStamp[6] = uVar1;
          std::__cxx11::string::~string((string *)&local_2c0);
          std::allocator<char>::~allocator(&local_2c1);
        }
      }
      return;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"no FBXHeaderExtension dictionary found",
             (allocator<char> *)((long)&shead + 7));
  Util::DOMError(&local_78,(Element *)0x0);
}

Assistant:

void Document::ReadHeader() {
    // Read ID objects from "Objects" section
    const Scope& sc = parser.GetRootScope();
    const Element* const ehead = sc["FBXHeaderExtension"];
    if(!ehead || !ehead->Compound()) {
        DOMError("no FBXHeaderExtension dictionary found");
    }

    const Scope& shead = *ehead->Compound();
    fbxVersion = ParseTokenAsInt(GetRequiredToken(GetRequiredElement(shead,"FBXVersion",ehead),0));

    // While we may have some success with newer files, we don't support
    // the older 6.n fbx format
    if(fbxVersion < LowerSupportedVersion ) {
        DOMError("unsupported, old format version, supported are only FBX 2011, FBX 2012 and FBX 2013");
    }
    if(fbxVersion > UpperSupportedVersion ) {
        if(Settings().strictMode) {
            DOMError("unsupported, newer format version, supported are only FBX 2011, FBX 2012 and FBX 2013"
                " (turn off strict mode to try anyhow) ");
        }
        else {
            DOMWarning("unsupported, newer format version, supported are only FBX 2011, FBX 2012 and FBX 2013,"
                " trying to read it nevertheless");
        }
    }

    const Element* const ecreator = shead["Creator"];
    if(ecreator) {
        creator = ParseTokenAsString(GetRequiredToken(*ecreator,0));
    }

    const Element* const etimestamp = shead["CreationTimeStamp"];
    if(etimestamp && etimestamp->Compound()) {
        const Scope& stimestamp = *etimestamp->Compound();
        creationTimeStamp[0] = ParseTokenAsInt(GetRequiredToken(GetRequiredElement(stimestamp,"Year"),0));
        creationTimeStamp[1] = ParseTokenAsInt(GetRequiredToken(GetRequiredElement(stimestamp,"Month"),0));
        creationTimeStamp[2] = ParseTokenAsInt(GetRequiredToken(GetRequiredElement(stimestamp,"Day"),0));
        creationTimeStamp[3] = ParseTokenAsInt(GetRequiredToken(GetRequiredElement(stimestamp,"Hour"),0));
        creationTimeStamp[4] = ParseTokenAsInt(GetRequiredToken(GetRequiredElement(stimestamp,"Minute"),0));
        creationTimeStamp[5] = ParseTokenAsInt(GetRequiredToken(GetRequiredElement(stimestamp,"Second"),0));
        creationTimeStamp[6] = ParseTokenAsInt(GetRequiredToken(GetRequiredElement(stimestamp,"Millisecond"),0));
    }
}